

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags,
                     ImGuiWindow *docked_window)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  ImGuiWindow *pIVar5;
  ImGuiDockNode *pIVar6;
  ImDrawList *draw_list;
  bool bVar7;
  char cVar8;
  ImU32 id;
  int iVar9;
  int iVar10;
  ImU32 col;
  ImGuiID close_button_id;
  bool *pbVar11;
  ImVec2 IVar12;
  ImGuiTabItem *it;
  size_t sVar13;
  char *pcVar14;
  uint flags_00;
  ImGuiContext *pIVar15;
  ImGuiCol idx;
  int iVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar20;
  float local_c4;
  bool local_c0;
  bool held;
  float local_9c;
  undefined1 local_98 [16];
  ImGuiWindow *local_88;
  uint local_80;
  uint local_7c;
  ImVec2 local_78;
  bool hovered;
  undefined7 uStack_6f;
  float fStack_6c;
  ImRect bb;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar15 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  if (pIVar5->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID(tab_bar,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    PushItemFlag(0x18,true);
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0);
    PopItemFlag();
    return false;
  }
  pbVar11 = (bool *)0x0;
  flags_00 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    pbVar11 = p_open;
    flags_00 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    flags_00 = flags;
  }
  IVar12 = TabItemCalcSize(label,pbVar11 != (bool *)0x0);
  local_98._8_4_ = extraout_XMM0_Dc;
  local_98._0_4_ = IVar12.x;
  local_98._4_4_ = IVar12.y;
  local_98._12_4_ = extraout_XMM0_Dd;
  IVar12 = (ImVec2)TabBarFindTabByID(tab_bar,id);
  it = (ImGuiTabItem *)IVar12;
  local_88 = pIVar5;
  if (IVar12 == (ImVec2)0x0) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ImVector<ImGuiTabItem>::push_back(&tab_bar->Tabs,(ImGuiTabItem *)&bb);
    it = ImVector<ImGuiTabItem>::back(&tab_bar->Tabs);
    it->ID = id;
    it->Width = (float)local_98._0_4_;
  }
  iVar9 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,it);
  tab_bar->LastTabItemIdx = (short)iVar9;
  it->ContentWidth = (float)local_98._0_4_;
  iVar9 = tab_bar->PrevFrameVisible;
  local_7c = tab_bar->Flags;
  iVar3 = pIVar15->FrameCount;
  iVar16 = it->LastFrameVisible;
  it->LastFrameVisible = iVar3;
  it->Flags = flags_00;
  it->Window = docked_window;
  if ((local_7c >> 0x14 & 1) == 0) {
    local_78 = IVar12;
    if (docked_window != (ImGuiWindow *)0x0) {
      __assert_fail("tab->Window == __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_widgets.cpp"
                    ,0x1c42,
                    "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                   );
    }
    iVar4 = (tab_bar->TabsNames).Buf.Size;
    iVar10 = iVar4 + -1;
    if (iVar4 == 0) {
      iVar10 = 0;
    }
    it->NameOffset = iVar10;
    sVar13 = strlen(label);
    ImGuiTextBuffer::append(&tab_bar->TabsNames,label,label + sVar13 + 1);
    IVar12 = local_78;
  }
  else {
    if (docked_window == (ImGuiWindow *)0x0) {
      __assert_fail("tab->Window != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_widgets.cpp"
                    ,0x1c3d,
                    "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                   );
    }
    it->NameOffset = -1;
  }
  iVar9 = iVar9 + 1;
  iVar16 = iVar16 + 1;
  uVar17 = tab_bar->Flags;
  if (iVar16 < iVar3) {
    if ((((uVar17 & 2) != 0) && (tab_bar->NextSelectedTabId == 0)) &&
       ((iVar3 <= iVar9 || (tab_bar->SelectedTabId == 0)))) {
      tab_bar->NextSelectedTabId = id;
    }
  }
  else if ((uVar17 & 1) == 0) {
    fVar1 = tab_bar->OffsetNextTab;
    it->Offset = fVar1;
    tab_bar->OffsetNextTab = it->Width + (pIVar15->Style).ItemInnerSpacing.x + fVar1;
  }
  if (((flags_00 & 2) != 0) && (tab_bar->SelectedTabId != id)) {
    tab_bar->NextSelectedTabId = id;
  }
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    local_c0 = true;
  }
  else {
    local_c0 = false;
    if (((tab_bar->SelectedTabId == 0) && (docked_window == (ImGuiWindow *)0x0)) && (iVar9 < iVar3))
    {
      if ((tab_bar->Tabs).Size == 1) {
        local_c0 = (uVar17 & 2) == 0;
      }
      else {
        local_c0 = false;
      }
    }
  }
  if ((iVar16 < iVar3) && (IVar12 == (ImVec2)0x0 || iVar3 <= iVar9)) {
    PushItemFlag(0x18,true);
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0);
    PopItemFlag();
    return local_c0;
  }
  if (tab_bar->SelectedTabId == id) {
    it->LastFrameSelected = pIVar15->FrameCount;
  }
  local_78 = (local_88->DC).CursorPos;
  fVar1 = it->Width;
  IVar12 = (tab_bar->BarRect).Min;
  fVar18 = (float)(int)(it->Offset - tab_bar->ScrollingAnim) + IVar12.x;
  fVar19 = IVar12.y + 0.0;
  IVar12.y = fVar19;
  IVar12.x = fVar18;
  (local_88->DC).CursorPos = IVar12;
  bb.Max.x = fVar1 + fVar18;
  bb.Max.y = (float)local_98._4_4_ + fVar19;
  bb.Min.y = fVar19;
  bb.Min.x = fVar18;
  fVar1 = (tab_bar->BarRect).Min.x;
  fVar2 = (tab_bar->BarRect).Max.x;
  local_80 = -(uint)(fVar18 < fVar1 || fVar2 < bb.Max.x);
  local_98._0_8_ = pIVar15;
  if ((local_80 & 1) != 0) {
    fStack_6c = fVar19 + -1.0;
    _hovered = (float)(~-(uint)(fVar1 <= fVar18) & (uint)fVar1 |
                      -(uint)(fVar1 <= fVar18) & (uint)fVar18);
    _held = fVar2;
    local_9c = bb.Max.y;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
    fVar18 = bb.Min.x;
    fVar19 = bb.Min.y;
    pIVar15 = (ImGuiContext *)local_98._0_8_;
  }
  _hovered = bb.Max.x - fVar18;
  fStack_6c = bb.Max.y - fVar19;
  IVar12 = (local_88->DC).CursorMaxPos;
  ItemSize((ImVec2 *)&hovered,(pIVar15->Style).FramePadding.y);
  pIVar5 = local_88;
  (local_88->DC).CursorMaxPos = IVar12;
  bVar7 = ItemAdd(&bb,id,(ImRect *)0x0);
  if (!bVar7) {
    if ((local_80 & 1) != 0) {
      PopClipRect();
    }
    (pIVar5->DC).CursorPos = local_78;
    return local_c0;
  }
  uVar17 = 0x102;
  if (pIVar15->DragDropActive == true) {
    bVar7 = ImGuiPayload::IsDataType((ImGuiPayload *)(local_98._0_8_ + 0x1f58),"_IMWINDOW");
    uVar17 = (uint)!bVar7 << 6 | 0x102;
  }
  bVar7 = ButtonBehavior(&bb,id,&hovered,&held,uVar17);
  if (bVar7) {
    tab_bar->NextSelectedTabId = id;
  }
  hovered = (bool)(hovered | *(ImU32 *)(local_98._0_8_ + 0x1c24) == id);
  if (((docked_window != (ImGuiWindow *)0x0 && held == true) &&
      (*(ImU32 *)(local_98._0_8_ + 0x1c38) == id)) && (*(char *)(local_98._0_8_ + 0x1c44) == '\x01')
     ) {
    *(ImGuiWindow **)(local_98._0_8_ + 0x1c68) = docked_window;
  }
  if (held == false) {
    SetItemAllowOverlap();
  }
  if ((((docked_window == (ImGuiWindow *)0x0) ||
       (pIVar6 = docked_window->DockNode, pIVar6 == (ImGuiDockNode *)0x0)) ||
      (pIVar6->ParentNode != (ImGuiDockNode *)0x0)) || ((pIVar6->LocalFlags & 0x400U) != 0)) {
LAB_001cedde:
  }
  else if ((held == true) && ((pIVar6->Windows).Size == 1)) {
    bVar7 = IsMouseDragging(0,0.0);
    if (bVar7) {
      StartMouseMovingWindow(docked_window);
      goto LAB_001cefdd;
    }
    goto LAB_001cedde;
  }
  if (((held & 1U) == 0) || (iVar16 < iVar3)) goto LAB_001cefdd;
  bVar7 = IsMouseDragging(0,-1.0);
  if (!bVar7) goto LAB_001cefdd;
  local_c4 = 0.0;
  if (*(bool *)(local_98._0_8_ + 0x1f44) != false) goto LAB_001cee27;
  uVar17 = tab_bar->Flags;
  if (docked_window == (ImGuiWindow *)0x0 && (uVar17 & 1) == 0) goto LAB_001cefdd;
  fVar1 = (((ImGuiIO *)(local_98._0_8_ + 8))->MouseDelta).x;
  if (0.0 <= fVar1) {
LAB_001cf18d:
    if (0.0 < fVar1) {
      fVar1 = (((ImGuiIO *)(local_98._0_8_ + 8))->MousePos).x;
      if ((bb.Max.x < fVar1) && (local_c4 = fVar1 - bb.Max.x, (uVar17 & 1) != 0)) {
        iVar9 = 1;
        goto LAB_001cf1cd;
      }
    }
  }
  else {
    fVar2 = (((ImGuiIO *)(local_98._0_8_ + 8))->MousePos).x;
    if (bb.Min.x <= fVar2) goto LAB_001cf18d;
    local_c4 = bb.Min.x - fVar2;
    if ((uVar17 & 1) == 0) goto LAB_001cee27;
    iVar9 = -1;
LAB_001cf1cd:
    TabBarQueueChangeTabOrder(tab_bar,it,iVar9);
  }
LAB_001cee27:
  if ((docked_window == (ImGuiWindow *)0x0) || ((docked_window->Flags & 4) != 0)) goto LAB_001cefdd;
  pIVar15 = (ImGuiContext *)local_98._0_8_;
  if ((((ImGuiContext *)local_98._0_8_)->DragDropActive != true) ||
     ((((ImGuiContext *)local_98._0_8_)->DragDropPayload).SourceId != id)) {
    fVar1 = ((ImGuiContext *)local_98._0_8_)->FontSize;
    fVar18 = (ABS((((ImGuiContext *)local_98._0_8_)->IO).MouseDragMaxDistanceAbs[0].x) -
             (fVar1 + fVar1)) * 0.2;
    fVar2 = fVar1 * 4.0;
    if (fVar18 <= fVar1 * 4.0) {
      fVar2 = fVar18;
    }
    fVar19 = (((ImGuiContext *)local_98._0_8_)->IO).MousePos.y;
    fVar20 = bb.Min.y - fVar19;
    fVar19 = fVar19 - bb.Max.y;
    uVar17 = -(uint)(fVar19 <= fVar20);
    if ((float)(~uVar17 & (uint)fVar19 | (uint)fVar20 & uVar17) <
        fVar1 * 1.5 + (float)(~-(uint)(fVar18 < 0.0) & (uint)fVar2)) {
      if (local_c4 <= fVar1 * 2.2) goto LAB_001cefdd;
      cVar8 = tab_bar->ReorderRequestDir;
      if (cVar8 < '\0') {
        iVar9 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,it);
        pIVar15 = (ImGuiContext *)local_98._0_8_;
        if (iVar9 == 0) goto LAB_001cef37;
        cVar8 = tab_bar->ReorderRequestDir;
      }
      if (cVar8 < '\x01') goto LAB_001cefdd;
      iVar9 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,it);
      pIVar15 = (ImGuiContext *)local_98._0_8_;
      if (iVar9 != (tab_bar->Tabs).Size + -1) goto LAB_001cefdd;
    }
  }
LAB_001cef37:
  DockContextQueueUndockWindow(pIVar15,docked_window);
  *(ImGuiWindow **)(local_98._0_8_ + 0x1c08) = docked_window;
  *(ImGuiID *)(local_98._0_8_ + 0x1c38) = docked_window->MoveId;
  *(ulong *)(local_98._0_8_ + 0x1c60) =
       CONCAT44((float)((ulong)*(undefined8 *)(local_98._0_8_ + 0x1c60) >> 0x20) -
                ((docked_window->Pos).y - bb.Min.y),
                (float)*(undefined8 *)(local_98._0_8_ + 0x1c60) -
                ((docked_window->Pos).x - bb.Min.x));
LAB_001cefdd:
  draw_list = pIVar5->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if (local_c0 == false) {
      idx = (uint)((local_7c >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((local_7c >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&bb,flags_00,col);
  RenderNavHighlight(&bb,id,1);
  bVar7 = IsItemHovered(8);
  if ((bVar7) && ((bVar7 = IsMouseClicked(1,false), bVar7 || (bVar7 = IsMouseReleased(1), bVar7))))
  {
    tab_bar->NextSelectedTabId = id;
  }
  uVar17 = tab_bar->Flags;
  if (pbVar11 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = ImGuiWindow::GetID(local_88,(void *)((ulong)id + 1));
  }
  bVar7 = TabItemLabelAndCloseButton
                    (draw_list,&bb,uVar17 >> 1 & 4 | flags_00,tab_bar->FramePadding,label,id,
                     close_button_id,local_c0);
  if ((pbVar11 != (bool *)0x0) && (bVar7)) {
    *pbVar11 = false;
    TabBarCloseTab(tab_bar,it);
  }
  IVar12 = local_78;
  if ((local_80 & 1) != 0) {
    PopClipRect();
  }
  (local_88->DC).CursorPos = IVar12;
  if ((((*(ImU32 *)(local_98._0_8_ + 0x1c24) == id) && (held == false)) &&
      (0.5 < *(float *)(local_98._0_8_ + 0x1c34))) &&
     (((bVar7 = IsItemHovered(0), bVar7 && ((tab_bar->Flags & 0x20) == 0)) &&
      ((it->Flags & 0x10) == 0)))) {
    pcVar14 = FindRenderedTextEnd(label,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar14 - (int)label),label);
  }
  return local_c0;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags, ImGuiWindow* docked_window)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render. We make a dummy call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (short)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;
    tab->Window = docked_window;

    // Append name with zero-terminator
    if (tab_bar->Flags & ImGuiTabBarFlags_DockNode)
    {
        IM_ASSERT(tab->Window != NULL);
        tab->NameOffset = -1;
    }
    else
    {
        IM_ASSERT(tab->Window == NULL);
        tab->NameOffset = tab_bar->TabsNames.size();
        tab_bar->TabsNames.append(label, label + strlen(label) + 1); // Append name _with_ the zero-terminator.
    }

    // If we are not reorderable, always reset offset based on submission order.
    // (We already handled layout and sizing using the previous known order, but sizing is not affected by order!)
    if (!tab_appearing && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
    {
        tab->Offset = tab_bar->OffsetNextTab;
        tab_bar->OffsetNextTab += tab->Width + g.Style.ItemInnerSpacing.x;
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing && docked_window == NULL)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    size.x = tab->Width;
    window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    bool want_clip_rect = (bb.Min.x < tab_bar->BarRect.Min.x) || (bb.Max.x > tab_bar->BarRect.Max.x);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->BarRect.Min.x), bb.Min.y - 1), ImVec2(tab_bar->BarRect.Max.x, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = (ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive && !g.DragDropPayload.IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW))
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Transfer active id window so the active id is not owned by the dock host (as StartMouseMovingWindow()
    // will only do it on the drag). This allows FocusWindow() to be more conservative in how it clears active id.
    if (held && docked_window && g.ActiveId == id && g.ActiveIdIsJustActivated)
        g.ActiveIdWindow = docked_window;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop a single floating window node moves it
    ImGuiDockNode* node = docked_window ? docked_window->DockNode : NULL;
    const bool single_floating_window_node = node && node->IsFloatingNode() && (node->Windows.Size == 1);
    if (held && single_floating_window_node && IsMouseDragging(0, 0.0f))
    {
        // Move
        StartMouseMovingWindow(docked_window);
    }
    else if (held && !tab_appearing && IsMouseDragging(0))
    {
        // Drag and drop: re-order tabs
        float drag_distance_from_edge_x = 0.0f;
        if (!g.DragDropActive && ((tab_bar->Flags & ImGuiTabBarFlags_Reorderable) || (docked_window != NULL)))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                drag_distance_from_edge_x = bb.Min.x - g.IO.MousePos.x;
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                drag_distance_from_edge_x = g.IO.MousePos.x - bb.Max.x;
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, +1);
            }
        }

        // Extract a Dockable window out of it's tab bar
        if (docked_window != NULL && !(docked_window->Flags & ImGuiWindowFlags_NoMove))
        {
            // We use a variable threshold to distinguish dragging tabs within a tab bar and extracting them out of the tab bar
            bool undocking_tab = (g.DragDropActive && g.DragDropPayload.SourceId == id);

            if (!undocking_tab) //&& (!g.IO.ConfigDockingWithShift || g.IO.KeyShift)
            {
                float threshold_base = g.FontSize;
                //float threshold_base = g.IO.ConfigDockingWithShift ? g.FontSize * 0.5f : g.FontSize;
                float threshold_x = (threshold_base * 2.2f);
                float threshold_y = (threshold_base * 1.5f) + ImClamp((ImFabs(g.IO.MouseDragMaxDistanceAbs[0].x) - threshold_base * 2.0f) * 0.20f, 0.0f, threshold_base * 4.0f);
                //GetForegroundDrawList()->AddRect(ImVec2(bb.Min.x - threshold_x, bb.Min.y - threshold_y), ImVec2(bb.Max.x + threshold_x, bb.Max.y + threshold_y), IM_COL32_WHITE); // [DEBUG]

                float distance_from_edge_y = ImMax(bb.Min.y - g.IO.MousePos.y, g.IO.MousePos.y - bb.Max.y);
                if (distance_from_edge_y >= threshold_y)
                    undocking_tab = true;
                else if (drag_distance_from_edge_x > threshold_x)
                    if ((tab_bar->ReorderRequestDir < 0 && tab_bar->GetTabOrder(tab) == 0) || (tab_bar->ReorderRequestDir > 0 && tab_bar->GetTabOrder(tab) == tab_bar->Tabs.Size - 1))
                        undocking_tab = true;
            }

            if (undocking_tab)
            {
                // Undock
                DockContextQueueUndockWindow(&g, docked_window);
                g.MovingWindow = docked_window;
                g.ActiveId = g.MovingWindow->MoveId;
                g.ActiveIdClickOffset -= g.MovingWindow->Pos - bb.Min;
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? window->GetID((void*)((intptr_t)id + 1)) : 0;
    bool just_closed = TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    return tab_contents_visible;
}